

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool ON_SubDEdgeSharpness::IsConstant(size_t edge_count,ON_SubDEdgePtr *edges,bool bCreaseResult)

{
  ulong uVar1;
  ON_SubDEdgeSharpness OVar2;
  ON_SubDEdgeSharpness OVar3;
  ulong uVar4;
  ON_SubDEdge *edge;
  ON_SubDEdge *pOVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float local_48;
  float fStack_44;
  
  if (edges == (ON_SubDEdgePtr *)0x0 || edge_count == 0) {
    return false;
  }
  uVar4 = edges->m_ptr;
  pOVar5 = (ON_SubDEdge *)(uVar4 & 0xfffffffffffffff8);
  if (pOVar5 == (ON_SubDEdge *)0x0) {
    fVar8 = Nan.m_edge_sharpness[0];
    fVar9 = Nan.m_edge_sharpness[1];
  }
  else {
    OVar2 = ON_SubDEdge::Sharpness(pOVar5,true);
    fVar8 = OVar2.m_edge_sharpness[0];
    fVar9 = OVar2.m_edge_sharpness[1];
    if ((uVar4 & 1) != 0) {
      fVar8 = OVar2.m_edge_sharpness[1];
      fVar9 = OVar2.m_edge_sharpness[0];
    }
  }
  OVar2.m_edge_sharpness = Nan.m_edge_sharpness;
  if (fVar8 != fVar9) {
    return false;
  }
  if (NAN(fVar8) || NAN(fVar9)) {
    return false;
  }
  if (0.0 <= fVar8) {
    bVar6 = fVar8 <= 4.0;
    if (!bCreaseResult || bVar6) goto LAB_005d36de;
  }
  else if (!bCreaseResult) {
    return false;
  }
  bVar6 = fVar8 == 5.0;
LAB_005d36de:
  if (pOVar5 == (ON_SubDEdge *)0x0) {
    return false;
  }
  if (!bVar6) {
    return false;
  }
  if (pOVar5->m_vertex[(uint)uVar4 & 1] == (ON_SubDVertex *)0x0) {
    return false;
  }
  bVar6 = edge_count == 0;
  if (!bVar6) {
    uVar4 = 1;
    while( true ) {
      uVar1 = edges[uVar4 - 1].m_ptr;
      local_48 = OVar2.m_edge_sharpness[0];
      fStack_44 = OVar2.m_edge_sharpness[1];
      pOVar5 = (ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8);
      if (pOVar5 != (ON_SubDEdge *)0x0) {
        OVar3 = ON_SubDEdge::Sharpness(pOVar5,true);
        local_48 = OVar3.m_edge_sharpness[0];
        fStack_44 = OVar3.m_edge_sharpness[1];
        if ((uVar1 & 1) != 0) {
          local_48 = OVar3.m_edge_sharpness[1];
          fStack_44 = OVar3.m_edge_sharpness[0];
        }
      }
      if (fVar8 != local_48) {
        return bVar6;
      }
      if (fVar8 != fStack_44) {
        return bVar6;
      }
      if (NAN(fVar8) || NAN(fStack_44)) break;
      bVar6 = edge_count <= uVar4;
      bVar7 = uVar4 == edge_count;
      uVar4 = uVar4 + 1;
      if (bVar7) {
        return bVar6;
      }
    }
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool ON_SubDEdgeSharpness::IsConstant(
  size_t edge_count,
  const ON_SubDEdgePtr* edges,
  bool bCreaseResult
)
{
  if (edge_count < 1 || nullptr == edges)
    return false;
  
  ON_SubDEdgeSharpness s = edges[0].RelativeSharpness(true);
  if (false == s.IsConstant(bCreaseResult))
    return false;
  const double c = s[0];
  if (nullptr == edges[0].RelativeVertex(0))
    return false; // not an edge chain
  for (size_t i = 0; i < edge_count; ++i)
  {
    s = edges[i].RelativeSharpness(true);
    if ( false == (c == s.EndSharpness(0) && c == s.EndSharpness(1)))
      return false;
  }

  return true;
}